

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O3

void PatternGridHeaderTU::drawMinus(QPainter *painter,int xpos,QColor *color)

{
  QColor local_10;
  
  local_10.cspec = xpos + Hsv;
  local_10.ct._0_4_ = 0x1b;
  local_10.ct._4_4_ = xpos + 9;
  local_10._12_4_ = 0x1c;
  QPainter::fillRect((QRect *)painter,&local_10);
  return;
}

Assistant:

void drawMinus(QPainter &painter, int xpos, QColor const& color) {
    painter.fillRect(
        xpos + PM_VPAD, 
        MINUS_START_Y + PM_HPAD + PM_CENTER,
        PM_LENGTH,
        PM_THICKNESS,
        color
    );
}